

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::UTF8CollationIterator::handleNextCE32
          (UTF8CollationIterator *this,UChar32 *c,UErrorCode *param_2)

{
  int32_t *pi;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *s;
  UTrie2 *pUVar4;
  UChar32 c_00;
  uint32_t uVar5;
  uint32_t *puVar6;
  uint c_01;
  ulong uVar7;
  uint uVar8;
  
  iVar2 = this->pos;
  if (iVar2 == this->length) {
    *c = -1;
    uVar5 = 0xc0;
  }
  else {
    s = this->u8;
    this->pos = iVar2 + 1;
    bVar1 = s[iVar2];
    uVar7 = (ulong)bVar1;
    *c = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pi = &this->pos;
      iVar2 = this->length;
      c_01 = (uint)bVar1;
      if ((bVar1 & 0xf0) != 0xe0) {
        if ((((byte)(bVar1 + 0x3e) < 0x1e) && (*pi != iVar2)) &&
           (uVar8 = s[*pi] ^ 0x80, (byte)uVar8 < 0x40)) {
          pUVar4 = (this->super_CollationIterator).trie;
          uVar5 = pUVar4->data32[pUVar4->index[(ulong)c_01 + 0x760] + uVar8];
          *c = (c_01 & 0x1f) << 6 | uVar8;
          this->pos = this->pos + 1;
          return uVar5;
        }
LAB_0022bf20:
        c_00 = utf8_nextCharSafeBody_63(s,pi,iVar2,c_01,-3);
        *c = c_00;
        uVar5 = CollationData::getCE32((this->super_CollationIterator).data,c_00);
        return uVar5;
      }
      iVar3 = *pi;
      if (iVar2 <= iVar3 + 1 && -1 < iVar2) goto LAB_0022bf20;
      if ((((byte)" 000000000000\x1000"[c_01 & 0xf] >> (s[iVar3] >> 5) & 1) == 0) ||
         (0x3f < (byte)(s[(long)iVar3 + 1] ^ 0x80))) goto LAB_0022bf20;
      *c = (s[iVar3] & 0x3f) << 6 | (c_01 & 0xf) << 0xc | s[(long)iVar3 + 1] ^ 0x80;
      this->pos = this->pos + 2;
      pUVar4 = (this->super_CollationIterator).trie;
      puVar6 = pUVar4->data32;
      uVar7 = (ulong)((*c & 0x1fU) + (uint)pUVar4->index[*c >> 5] * 4);
    }
    else {
      puVar6 = ((this->super_CollationIterator).trie)->data32;
    }
    uVar5 = puVar6[uVar7];
  }
  return uVar5;
}

Assistant:

uint32_t
UTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode & /*errorCode*/) {
    if(pos == length) {
        c = U_SENTINEL;
        return Collation::FALLBACK_CE32;
    }
    // Optimized combination of U8_NEXT_OR_FFFD() and UTRIE2_U8_NEXT32().
    c = u8[pos++];
    if(U8_IS_SINGLE(c)) {
        // ASCII 00..7F
        return trie->data32[c];
    }
    uint8_t t1, t2;
    if(0xe0 <= c && c < 0xf0 &&
            ((pos + 1) < length || length < 0) &&
            U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
            (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
        // U+0800..U+FFFF except surrogates
        c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
        pos += 2;
        return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
    } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
        // U+0080..U+07FF
        uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
        c = ((c & 0x1f) << 6) | t1;
        ++pos;
        return ce32;
    } else {
        // Function call for supplementary code points and error cases.
        // Illegal byte sequences yield U+FFFD.
        c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
        return data->getCE32(c);
    }
}